

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode Curl_multi_pollset_ev
                    (Curl_multi *multi,Curl_easy *data,easy_pollset *ps,easy_pollset *last_ps)

{
  int *piVar1;
  Curl_multi *pCVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  Curl_hash *pCVar6;
  void *pvVar7;
  Curl_hash *h;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  int local_68;
  CURLMcode local_64;
  Curl_easy *local_60;
  easy_pollset *local_58;
  Curl_multi *local_50;
  Curl_hash *local_48;
  int local_3c;
  easy_pollset *local_38;
  
  local_60 = data;
  local_58 = last_ps;
  local_50 = multi;
  if (ps->num != 0) {
    local_48 = &multi->sockhash;
    uVar10 = 0;
    local_38 = ps;
    do {
      bVar8 = ps->actions[uVar10];
      iVar4 = ps->sockets[uVar10];
      local_68 = iVar4;
      if (iVar4 == -1) {
        pCVar6 = (Curl_hash *)0x0;
      }
      else {
        pCVar6 = (Curl_hash *)Curl_hash_pick(local_48,&local_68,4);
      }
      if (pCVar6 == (Curl_hash *)0x0) {
        local_3c = iVar4;
        if (iVar4 == -1) {
          pCVar6 = (Curl_hash *)0x0;
          local_68 = iVar4;
        }
        else {
          local_68 = iVar4;
          pCVar6 = (Curl_hash *)Curl_hash_pick(local_48,&local_68,4);
        }
        if (pCVar6 == (Curl_hash *)0x0) {
          pCVar6 = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
          if (pCVar6 != (Curl_hash *)0x0) {
            Curl_hash_init(pCVar6,0xd,trhash,trhash_compare,trhash_dtor);
            pvVar7 = Curl_hash_add(local_48,&local_3c,4,pCVar6);
            if (pvVar7 != (void *)0x0) goto LAB_001472f8;
            Curl_hash_destroy(pCVar6);
            (*Curl_cfree)(pCVar6);
          }
          pCVar6 = (Curl_hash *)0x0;
        }
LAB_001472f8:
        if (pCVar6 != (Curl_hash *)0x0) goto LAB_00147301;
        local_64 = CURLM_OUT_OF_MEMORY;
        bVar11 = true;
      }
      else {
        if (last_ps->num != 0) {
          lVar9 = 0;
          do {
            if (iVar4 == last_ps->sockets[lVar9]) {
              bVar3 = last_ps->actions[lVar9];
              goto LAB_00147303;
            }
            lVar9 = lVar9 + 1;
          } while (last_ps->num != (uint)lVar9);
        }
LAB_00147301:
        bVar3 = 0;
LAB_00147303:
        if (bVar3 == 0) {
LAB_00147317:
          pvVar7 = Curl_hash_pick(pCVar6,&local_60,8);
          if (pvVar7 == (void *)0x0) {
            piVar1 = (int *)((long)&pCVar6[1].table + 4);
            *piVar1 = *piVar1 + 1;
            if ((bVar8 & 1) != 0) {
              *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + 1;
            }
            if ((bVar8 & 2) != 0) {
              piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
              *piVar1 = *piVar1 + 1;
            }
            pvVar7 = Curl_hash_add(pCVar6,&local_60,8,local_60);
            if (pvVar7 == (void *)0x0) {
              Curl_hash_destroy(pCVar6);
              local_64 = CURLM_OUT_OF_MEMORY;
              bVar11 = true;
              last_ps = local_58;
              goto LAB_00147449;
            }
          }
        }
        else if (bVar3 == bVar8) {
          if (bVar3 == 0) goto LAB_00147317;
        }
        else {
          if ((bVar3 & 1) != 0) {
            *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + -1;
          }
          if ((bVar3 & 2) != 0) {
            piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
            *piVar1 = *piVar1 + -1;
          }
          if ((bVar8 & 1) != 0) {
            *(int *)&pCVar6[1].comp_func = *(int *)&pCVar6[1].comp_func + 1;
          }
          if ((bVar8 & 2) != 0) {
            piVar1 = (int *)((long)&pCVar6[1].comp_func + 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        pCVar2 = local_50;
        last_ps = local_58;
        iVar5 = (uint)(*(int *)&pCVar6[1].comp_func != 0) +
                (uint)(*(int *)((long)&pCVar6[1].comp_func + 4) != 0) * 2;
        if ((bVar3 == 0) || (bVar11 = false, *(int *)&pCVar6[1].table != iVar5)) {
          if (local_50->socket_cb != (curl_socket_callback)0x0) {
            local_50->field_0x279 = local_50->field_0x279 | 4;
            iVar4 = (*local_50->socket_cb)
                              (local_60,iVar4,iVar5,local_50->socket_userp,pCVar6[1].hash_func);
            bVar8 = pCVar2->field_0x279 & 0xfb;
            pCVar2->field_0x279 = bVar8;
            if (iVar4 == -1) {
              pCVar2->field_0x279 = bVar8 | 0x10;
              local_64 = CURLM_ABORTED_BY_CALLBACK;
              bVar11 = true;
              ps = local_38;
              goto LAB_00147449;
            }
          }
          *(int *)&pCVar6[1].table = iVar5;
          bVar11 = false;
          ps = local_38;
        }
      }
LAB_00147449:
      if (bVar11) {
        return local_64;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < ps->num);
  }
  if (last_ps->num != 0) {
    pCVar6 = &local_50->sockhash;
    uVar10 = 0;
    do {
      iVar4 = last_ps->sockets[uVar10];
      if (ps->num != 0) {
        lVar9 = 0;
        do {
          if (iVar4 == ps->sockets[lVar9]) {
            bVar11 = false;
            goto LAB_00147584;
          }
          lVar9 = lVar9 + 1;
        } while (ps->num != (uint)lVar9);
      }
      local_68 = iVar4;
      if (iVar4 == -1) {
        h = (Curl_hash *)0x0;
      }
      else {
        h = (Curl_hash *)Curl_hash_pick(pCVar6,&local_68,4);
      }
      pCVar2 = local_50;
      bVar11 = false;
      if (h != (Curl_hash *)0x0) {
        bVar8 = local_58->actions[uVar10];
        iVar5 = *(int *)((long)&h[1].table + 4) + -1;
        *(int *)((long)&h[1].table + 4) = iVar5;
        if ((bVar8 & 2) != 0) {
          piVar1 = (int *)((long)&h[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar8 & 1) != 0) {
          *(int *)&h[1].comp_func = *(int *)&h[1].comp_func + -1;
        }
        if (iVar5 == 0) {
          if (local_50->socket_cb == (curl_socket_callback)0x0) {
            bVar11 = false;
          }
          else {
            local_50->field_0x279 = local_50->field_0x279 | 4;
            iVar5 = (*local_50->socket_cb)(local_60,iVar4,4,local_50->socket_userp,h[1].hash_func);
            pCVar2->field_0x279 = pCVar2->field_0x279 & 0xfb;
            bVar11 = iVar5 == -1;
          }
          local_68 = iVar4;
          Curl_hash_destroy(h);
          Curl_hash_delete(pCVar6,&local_68,4);
          if (bVar11) {
            local_50->field_0x279 = local_50->field_0x279 | 0x10;
            local_64 = CURLM_ABORTED_BY_CALLBACK;
          }
        }
        else {
          Curl_hash_delete(h,&local_60,8);
        }
      }
LAB_00147584:
      if (bVar11) {
        return local_64;
      }
      uVar10 = uVar10 + 1;
      last_ps = local_58;
    } while (uVar10 < local_58->num);
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_multi_pollset_ev(struct Curl_multi *multi,
                                struct Curl_easy *data,
                                struct easy_pollset *ps,
                                struct easy_pollset *last_ps)
{
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < ps->num; i++) {
    unsigned char cur_action = ps->actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = ps->sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j < last_ps->num; j++) {
        if(s == last_ps->sockets[j]) {
          last_action = last_ps->actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we did not have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN) {
        DEBUGASSERT(entry->readers);
        entry->readers--;
      }
      if(last_action & CURL_POLL_OUT) {
        DEBUGASSERT(entry->writers);
        entry->writers--;
      }
      if(cur_action & CURL_POLL_IN) {
        entry->readers++;
      }
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action &&
            !Curl_hash_pick(&entry->transfers, (char *)&data, /* hash key */
                            sizeof(struct Curl_easy *))) {
      DEBUGASSERT(entry->users < 100000); /* detect weird values */
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    /* store the current action state */
    entry->action = (unsigned int)comboaction;
  }

  /* Check for last_poll.sockets that no longer appear in ps->sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i < last_ps->num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = last_ps->sockets[i];
    for(j = 0; j < ps->num; j++) {
      if(s == ps->sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = last_ps->actions[i];
      /* this socket has been removed. Decrease user count */
      DEBUGASSERT(entry->users);
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        bool dead = FALSE;
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1)
            dead = TRUE;
        }
        sh_delentry(entry, &multi->sockhash, s);
        if(dead) {
          multi->dead = TRUE;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  return CURLM_OK;
}